

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall asl::Socket_::connect(Socket_ *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  Type TVar1;
  int iVar2;
  Type TVar3;
  Type TVar4;
  socklen_t __len_00;
  uint uVar5;
  sockaddr *__addr_00;
  undefined4 in_register_00000034;
  InetAddress *this_00;
  bool force;
  InetAddress *addr_local;
  Socket_ *this_local;
  
  this_00 = (InetAddress *)CONCAT44(in_register_00000034,__fd);
  iVar2 = InetAddress::length(this_00);
  if (iVar2 == 0) {
    this->_error = 3;
    this_local._7_1_ = 0;
  }
  else {
    TVar1 = this->_family;
    TVar3 = InetAddress::type(this_00);
    TVar4 = InetAddress::type(this_00);
    this->_family = TVar4;
    init(this,(EVP_PKEY_CTX *)(ulong)(TVar1 != TVar3));
    iVar2 = *(int *)&(this->super_SmartObject_).field_0xc;
    __addr_00 = (sockaddr *)InetAddress::ptr(this_00);
    __len_00 = InetAddress::length(this_00);
    uVar5 = ::connect(iVar2,__addr_00,__len_00);
    if (uVar5 == 0) {
      this_local._7_1_ = 1;
      this = (Socket_ *)(ulong)uVar5;
    }
    else {
      this->_error = 3;
      this_local._7_1_ = 0;
    }
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool Socket_::connect(const InetAddress& addr)
{
	if (addr.length() == 0)
	{
		_error = SOCKET_BAD_CONNECT;
		return false;
	}
	bool force = _family != addr.type();
	_family = addr.type();
	init(force);
	if (::connect(_handle, (const sockaddr*)addr.ptr(), addr.length()) == 0)
		return true;
	_error = SOCKET_BAD_CONNECT;
	return false;
}